

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::makeDirect(QPDFObjectHandle *this,bool allow_streams)

{
  undefined1 local_48 [8];
  set visited;
  bool allow_streams_local;
  QPDFObjectHandle *this_local;
  
  visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count._7_1_ = allow_streams;
  QPDFObjGen::set::set((set *)local_48);
  makeDirect(this,(set *)local_48,
             (bool)(visited.
                    super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
                    _M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1));
  QPDFObjGen::set::~set((set *)local_48);
  return;
}

Assistant:

void
QPDFObjectHandle::makeDirect(bool allow_streams)
{
    QPDFObjGen::set visited;
    makeDirect(visited, allow_streams);
}